

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O1

void __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConsiderEmulatingMultiobj
          (MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this)

{
  pointer *ppQVar1;
  _Base_ptr *pp_Var2;
  anon_struct_8_0_00000001_for___align aVar3;
  Type TVar4;
  double dVar5;
  Type TVar6;
  pointer pQVar7;
  iterator __position;
  pointer pdVar8;
  size_ty sVar9;
  ptr pdVar10;
  ptr ppVar11;
  iterator iVar12;
  BasicSolver *this_00;
  vector<int,std::allocator<int>> *this_01;
  _Base_ptr p_Var13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  double dVar18;
  vector<double,_std::allocator<double>_> vStack_2a8;
  _Base_ptr *pp_Stack_290;
  _Rb_tree_node_base _Stack_288;
  size_type sStack_268;
  double dStack_260;
  vector<double,_std::allocator<double>_> vStack_258;
  vector<double,_std::allocator<double>_> vStack_240;
  vector<int,_std::allocator<int>_> vStack_228;
  vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_> *pvStack_210;
  undefined1 auStack_208 [72];
  ptr piStack_1c0;
  ulong uStack_1b8;
  vector<double,std::allocator<double>> *pvStack_190;
  vector<double,std::allocator<double>> *pvStack_188;
  value_type *pvStack_180;
  undefined1 auStack_178 [24];
  type tStack_160;
  type atStack_150 [7];
  ptr pdStack_e0;
  ulong uStack_d8;
  ptr piStack_98;
  ulong uStack_90;
  ptr piStack_68;
  ulong uStack_60;
  
  this->status_ = NOT_ACTIVE;
  if (((int)((ulong)((long)this[-1].obj_new_tolr_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x3ef368eb < 2) ||
     ((pQVar7 = this[2].obj_new_.
                super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
                _M_impl.super__Vector_impl_data._M_start,
      *(char *)((long)&pQVar7[1].super_NLObjective.super_LinearObjective.lt_ + 0x54) == '\x01' &&
      ((-1 < *(int *)&(pQVar7->qt_).vars1_aux_.super_small_vector_base<std::allocator<int>,_6U>.
                      m_data.super_small_vector_data_base<int_*,_unsigned_long> ||
       (*(int *)((long)&pQVar7[1].super_NLObjective.super_LinearObjective.lt_ + 0x50) < 2)))))) {
    return;
  }
  this->status_ = RUNNING;
  *(undefined1 *)&this[-1].i_current_obj_ = 1;
  pp_Var2 = &_Stack_288._M_parent;
  _Stack_288._M_color = _S_red;
  _Stack_288._4_4_ = 0;
  _Stack_288._M_parent = (_Base_ptr)((ulong)_Stack_288._M_parent & 0xffffffffffffff00);
  auStack_178._0_8_ = "objpriority";
  auStack_178._8_8_ = (pointer)0xb;
  auStack_178._16_4_ = 2;
  aVar3 = (anon_struct_8_0_00000001_for___align)((long)auStack_178 + 0x28);
  pp_Stack_290 = pp_Var2;
  tStack_160.__align = aVar3;
  std::__cxx11::string::_M_construct<char*>((string *)(auStack_178 + 0x18),pp_Var2,pp_Var2);
  if (this[10].obj_new_.
      super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    std::__throw_bad_function_call();
  }
  (*(code *)this[10].obj_new_.
            super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
            _M_impl.super__Vector_impl_data._M_finish)
            (auStack_208,&this[9].objval_last_,auStack_178);
  ArrayRef<int>::move_or_copy(&vStack_228,(ArrayRef<int> *)auStack_208);
  if ((pointer)auStack_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)auStack_208._0_8_,auStack_208._16_8_ - auStack_208._0_8_);
  }
  if (tStack_160.__align != aVar3) {
    operator_delete((void *)tStack_160.__align,atStack_150[0].__align + 1);
  }
  if (pp_Stack_290 != pp_Var2) {
    operator_delete(pp_Stack_290,(ulong)((long)&(_Stack_288._M_parent)->_M_color + 1));
  }
  auStack_178._0_8_ = auStack_178._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::resize
            (&vStack_228,
             ((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4fbcda3ac10c9715,
             (value_type *)auStack_178);
  GetMOWeightsLegacy((ArrayRef<double> *)auStack_178,this);
  ArrayRef<double>::move_or_copy(&vStack_2a8,(ArrayRef<double> *)auStack_178);
  if ((ptr)auStack_178._0_8_ != (ptr)0x0) {
    operator_delete((void *)auStack_178._0_8_,auStack_178._16_8_ - auStack_178._0_8_);
  }
  if (vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start ==
      vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    auStack_178._0_8_ = &DAT_3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::resize
              (&vStack_2a8,
               ((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4fbcda3ac10c9715,
               (value_type_conflict3 *)auStack_178);
    FlipDiffSenseSigns(this,&vStack_2a8);
  }
  _Stack_288._M_color = _S_red;
  _Stack_288._4_4_ = 0;
  _Stack_288._M_parent = (_Base_ptr)((ulong)_Stack_288._M_parent & 0xffffffffffffff00);
  auStack_178._0_8_ = "objabstol";
  auStack_178._8_8_ = (pointer)0x9;
  auStack_178._16_4_ = 2;
  pp_Stack_290 = pp_Var2;
  tStack_160.__align = aVar3;
  std::__cxx11::string::_M_construct<char*>((string *)(auStack_178 + 0x18),pp_Var2,pp_Var2);
  if (this[10].obj_new_tola_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish == (pointer)0x0) {
    std::__throw_bad_function_call();
  }
  ppQVar1 = &this[10].obj_new_.
             super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  (*(code *)this[10].obj_new_tola_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage)(auStack_208,ppQVar1,auStack_178);
  ArrayRef<double>::move_or_copy(&vStack_240,(ArrayRef<double> *)auStack_208);
  if ((pointer)auStack_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)auStack_208._0_8_,auStack_208._16_8_ - auStack_208._0_8_);
  }
  if (tStack_160.__align != aVar3) {
    operator_delete((void *)tStack_160.__align,atStack_150[0].__align + 1);
  }
  if (pp_Stack_290 != pp_Var2) {
    operator_delete(pp_Stack_290,(ulong)((long)&(_Stack_288._M_parent)->_M_color + 1));
  }
  auStack_178._0_8_ = (ptr)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&vStack_240,
             ((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4fbcda3ac10c9715,
             (value_type_conflict3 *)auStack_178);
  _Stack_288._0_8_ = 0;
  _Stack_288._M_parent = (_Base_ptr)((ulong)_Stack_288._M_parent & 0xffffffffffffff00);
  auStack_178._0_8_ = "objreltol";
  auStack_178._8_8_ = (pointer)0x9;
  auStack_178._16_4_ = 2;
  pp_Stack_290 = pp_Var2;
  tStack_160.__align = aVar3;
  std::__cxx11::string::_M_construct<char*>((string *)(auStack_178 + 0x18),pp_Var2,pp_Var2);
  if (this[10].obj_new_tola_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish == (pointer)0x0) {
    std::__throw_bad_function_call();
  }
  (*(code *)this[10].obj_new_tola_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage)(auStack_208,ppQVar1,auStack_178);
  ArrayRef<double>::move_or_copy(&vStack_258,(ArrayRef<double> *)auStack_208);
  if ((pointer)auStack_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)auStack_208._0_8_,auStack_208._16_8_ - auStack_208._0_8_);
  }
  if (tStack_160.__align != aVar3) {
    operator_delete((void *)tStack_160.__align,atStack_150[0].__align + 1);
  }
  if (pp_Stack_290 != pp_Var2) {
    operator_delete(pp_Stack_290,(ulong)((long)&(_Stack_288._M_parent)->_M_color + 1));
  }
  auStack_178._0_8_ = (ptr)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&vStack_258,
             ((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4fbcda3ac10c9715,
             (value_type_conflict3 *)auStack_178);
  _Stack_288._M_left = &_Stack_288;
  _Stack_288._0_8_ = _Stack_288._0_8_ & 0xffffffff00000000;
  _Stack_288._M_parent = (_Base_ptr)0x0;
  sStack_268 = 0;
  auStack_178._0_8_ = auStack_178._0_8_ & 0xffffffff00000000;
  _Stack_288._M_right = _Stack_288._M_left;
  if (vStack_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      vStack_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar14 = 0;
    do {
      this_01 = (vector<int,std::allocator<int>> *)
                std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                              *)&pp_Stack_290,
                             vStack_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar14);
      __position._M_current = *(int **)(this_01 + 8);
      if (__position._M_current == *(int **)(this_01 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_01,__position,(int *)auStack_178);
      }
      else {
        *__position._M_current = auStack_178._0_4_;
        *(int **)(this_01 + 8) = __position._M_current + 1;
      }
      uVar14 = (long)(int)auStack_178._0_4_ + 1;
      auStack_178._0_4_ = (int)uVar14;
    } while (uVar14 < (ulong)((long)vStack_228.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_finish -
                              (long)vStack_228.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start >> 2));
  }
  pvStack_210 = &this->obj_new_;
  std::vector<mp::QuadraticObjective,std::allocator<mp::QuadraticObjective>>::
  _M_assign_aux<mp::QuadraticObjective_const*>
            ((vector<mp::QuadraticObjective,std::allocator<mp::QuadraticObjective>> *)pvStack_210,0,
             0);
  std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::reserve
            (pvStack_210,sStack_268);
  pvStack_188 = (vector<double,std::allocator<double>> *)&this->obj_new_tola_;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)pvStack_188,sStack_268);
  pvStack_190 = (vector<double,std::allocator<double>> *)&this->obj_new_tolr_;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)pvStack_190,sStack_268);
  p_Var13 = _Stack_288._M_left;
  while( true ) {
    if (p_Var13 == &_Stack_288) {
      this_00 = (BasicSolver *)
                this[2].obj_new_.
                super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (this_00->verbose_ != false) {
        auStack_178._0_8_ =
             ((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4fbcda3ac10c9715;
        auStack_178._16_8_ =
             ((long)(this->obj_new_).
                    super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->obj_new_).
                    super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4fbcda3ac10c9715;
        auStack_208._0_8_ = (pointer)0x55;
        auStack_208._8_8_ = auStack_178;
        BasicSolver::Print(this_00,(CStringRef)0x49e888,(ArgList *)auStack_208);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)&pp_Stack_290);
      if (vStack_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vStack_258.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_258.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (vStack_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vStack_240.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_240.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (vStack_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(vStack_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vStack_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    uVar16 = (ulong)(int)(p_Var13[1]._M_parent)->_M_color;
    pdVar8 = this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = ((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) *
             0x4fbcda3ac10c9715;
    if (uVar14 < uVar16 || uVar14 - uVar16 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    if ((ulong)((long)vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar16) break;
    pvStack_180 = (value_type *)(pdVar8 + uVar16 * 0x3d);
    dStack_260 = vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar16];
    std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::push_back
              (pvStack_210,pvStack_180);
    pQVar7 = (this->obj_new_).
             super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    *(double *)&pQVar7[-1].super_NLObjective.super_LinearObjective =
         *this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
    sVar9 = *(size_ty *)
             ((long)&pQVar7[-1].super_NLObjective.super_LinearObjective.lt_.coefs_.
                     super_small_vector_base<std::allocator<double>,_6U>.m_data.
                     super_small_vector_data_base<double_*,_unsigned_long> + 0x10);
    if (sVar9 != 0) {
      pdVar10 = pQVar7[-1].super_NLObjective.super_LinearObjective.lt_.coefs_.
                super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
      lVar17 = 0;
      do {
        *(double *)((long)pdVar10 + lVar17) = *(double *)((long)pdVar10 + lVar17) * dStack_260;
        lVar17 = lVar17 + 8;
      } while (sVar9 << 3 != lVar17);
    }
    sVar9 = pQVar7[-1].qt_.folded_.
            super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
            m_data.
            super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.
            m_size;
    if (sVar9 != 0) {
      ppVar11 = pQVar7[-1].qt_.folded_.
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                .m_data_ptr;
      lVar17 = 0;
      do {
        *(double *)((long)&ppVar11->second + lVar17) =
             *(double *)((long)&ppVar11->second + lVar17) * dStack_260;
        lVar17 = lVar17 + 0x10;
      } while (sVar9 << 4 != lVar17);
    }
    uVar14 = (ulong)(int)(p_Var13[1]._M_parent)->_M_color;
    if ((ulong)((long)vStack_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vStack_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar14) break;
    iVar12._M_current =
         (this->obj_new_tola_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar12._M_current ==
        (this->obj_new_tola_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                (pvStack_188,iVar12,
                 vStack_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar14);
    }
    else {
      *iVar12._M_current =
           vStack_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar14];
      (this->obj_new_tola_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar12._M_current + 1;
    }
    uVar14 = (ulong)(int)(p_Var13[1]._M_parent)->_M_color;
    if ((ulong)((long)vStack_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vStack_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar14) break;
    iVar12._M_current =
         (this->obj_new_tolr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar12._M_current ==
        (this->obj_new_tolr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                (pvStack_190,iVar12,
                 vStack_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar14);
    }
    else {
      *iVar12._M_current =
           vStack_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar14];
      (this->obj_new_tolr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar12._M_current + 1;
    }
    lVar17 = (long)p_Var13[1]._M_left - (long)p_Var13[1]._M_parent >> 2;
    while (lVar17 = lVar17 + -1, lVar17 != 0) {
      uVar16 = (ulong)*(int *)((long)p_Var13[1]._M_parent + lVar17 * 4);
      pdVar8 = this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar14 = ((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) *
               0x4fbcda3ac10c9715;
      if (uVar14 < uVar16 || uVar14 - uVar16 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      TVar6 = (pvStack_180->super_NLObjective).super_LinearObjective.sense_;
      TVar4 = *(Type *)(pdVar8 + uVar16 * 0x3d);
      uVar16 = (ulong)*(int *)((long)p_Var13[1]._M_parent + lVar17 * 4);
      if (uVar14 < uVar16 || uVar14 - uVar16 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<double>,6u> *)auStack_208,
                 pdVar8 + uVar16 * 0x3d + 1);
      gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<int>,6u> *)&piStack_1c0,
                 pdVar8 + uVar16 * 0x3d + 10);
      uVar14 = (ulong)*(int *)((long)p_Var13[1]._M_parent + lVar17 * 4);
      if ((ulong)((long)vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= uVar14) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      dVar5 = *(double *)(&DAT_0049c440 + (ulong)(TVar6 == TVar4) * 8);
      if ((pointer)auStack_208._16_8_ != (pointer)0x0) {
        dVar18 = vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar14];
        lVar15 = 0;
        do {
          *(double *)(auStack_208._0_8_ + lVar15) =
               *(double *)(auStack_208._0_8_ + lVar15) * dVar18 * dVar5;
          lVar15 = lVar15 + 8;
        } while (auStack_208._16_8_ << 3 != lVar15);
      }
      uVar16 = (ulong)*(int *)((long)p_Var13[1]._M_parent + lVar17 * 4);
      pdVar8 = this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar14 = ((long)this[-1].obj_new_tolr_.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8 >> 3) *
               0x4fbcda3ac10c9715;
      if (uVar14 < uVar16 || uVar14 - uVar16 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      dStack_260 = dVar5;
      QuadTerms::QuadTerms((QuadTerms *)auStack_178,(QuadTerms *)(pdVar8 + uVar16 * 0x3d + 0x15));
      uVar14 = (ulong)*(int *)((long)p_Var13[1]._M_parent + lVar17 * 4);
      if ((ulong)((long)vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= uVar14) {
LAB_00426f9f:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      if ((pointer)auStack_178._16_8_ != (pointer)0x0) {
        dVar5 = vStack_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14];
        lVar15 = 0;
        do {
          *(double *)((long)(auStack_178._0_8_ + 8) + lVar15) =
               *(double *)((long)(auStack_178._0_8_ + 8) + lVar15) * dStack_260 * dVar5;
          lVar15 = lVar15 + 0x10;
        } while (auStack_178._16_8_ << 4 != lVar15);
      }
      LinTerms::add(&(this->obj_new_).
                     super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].super_NLObjective.
                     super_LinearObjective.lt_,(LinTerms *)auStack_208);
      QuadTerms::add(&(this->obj_new_).
                      super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].qt_,(QuadTerms *)auStack_178);
      uVar14 = (ulong)*(int *)((long)p_Var13[1]._M_parent + lVar17 * 4);
      if ((ulong)((long)vStack_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vStack_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= uVar14) goto LAB_00426f9f;
      pdVar8 = (this->obj_new_tola_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      dVar5 = pdVar8[-1];
      dVar18 = vStack_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14];
      if (vStack_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14] <= dVar5) {
        dVar18 = dVar5;
      }
      pdVar8[-1] = dVar18;
      if ((ulong)((long)vStack_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)vStack_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= uVar14) goto LAB_00426f9f;
      pdVar8 = (this->obj_new_tolr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      dVar5 = pdVar8[-1];
      dVar18 = vStack_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14];
      if (vStack_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14] <= dVar5) {
        dVar18 = dVar5;
      }
      pdVar8[-1] = dVar18;
      if (6 < uStack_60) {
        operator_delete(piStack_68,uStack_60 << 2);
      }
      if (6 < uStack_90) {
        operator_delete(piStack_98,uStack_90 << 2);
      }
      if (6 < uStack_d8) {
        operator_delete(pdStack_e0,uStack_d8 << 3);
      }
      if ((pointer)0x8 < (ulong)auStack_178._8_8_) {
        operator_delete((void *)auStack_178._0_8_,auStack_178._8_8_ << 4);
      }
      if (6 < uStack_1b8) {
        operator_delete(piStack_1c0,uStack_1b8 << 2);
      }
      if ((Value *)0x6 < (ulong)auStack_208._8_8_) {
        operator_delete((void *)auStack_208._0_8_,auStack_208._8_8_ << 3);
      }
    }
    LinTerms::sort_terms
              (&(this->obj_new_).
                super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].super_NLObjective.
                super_LinearObjective.lt_,true);
    QuadTerms::sort_terms
              (&(this->obj_new_).
                super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].qt_);
    p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void ConsiderEmulatingMultiobj() {
    status_ = MOManagerStatus::NOT_ACTIVE;
    if (MPCD(num_objs())>1                                  // have multiple objectives
        && (MPCD(GetEnv()).multiobj_has_native()==false
            || MPCD(GetEnv()).multiobj()>1))                // force emulation
      SetupMultiobjEmulation();
    // Anything todo otherwise?
  }